

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpkdecoder.c
# Opt level: O0

uint8_t * XPKDecoder_Decode(XPKDecoder *d,XPKEntry *entry,LPStatus *status)

{
  long lVar1;
  byte bVar2;
  XPKEntry *d_00;
  uint uVar3;
  uint8_t *puVar4;
  size_t sVar5;
  uint8_t *puVar6;
  RepeatMarker *pRVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  RepeatMarker *marker_2;
  RepeatMarker *marker_1;
  RepeatMarker *marker;
  uint8_t *rgba;
  size_t rv;
  uint rgba_i;
  uint8_t *color;
  uchar argument;
  uchar instruction;
  LPStatus *pLStack_28;
  uchar byte;
  LPStatus *status_local;
  XPKEntry *entry_local;
  XPKDecoder *d_local;
  
  color._7_1_ = 0;
  color._6_1_ = 0;
  color._5_1_ = 0;
  pLStack_28 = status;
  status_local = (LPStatus *)entry;
  entry_local = (XPKEntry *)d;
  fseek((FILE *)entry->xpk->file,(ulong)entry->offset,0);
  xpk_decoder_init((XPKDecoder *)entry_local);
  puVar4 = (uint8_t *)
           calloc((long)(int)((uint)(ushort)(short)status_local[3] *
                             (uint)*(ushort *)((long)status_local + 0xe)),4);
  while( true ) {
    bVar10 = false;
    if (color._7_1_ == 0x41) {
      bVar10 = *(int *)&entry_local->xpk != 0;
    }
    if (bVar10) break;
    sVar5 = ReadUint8((FILE *)**(undefined8 **)status_local,1,(uint8_t *)((long)&color + 7));
    d_00 = entry_local;
    bVar2 = color._7_1_;
    if (sVar5 == 0) {
      LPWarn("xpk","couldn\'t ReadUint8");
      *pLStack_28 = LUNAPURPURA_ERROR;
      return (uint8_t *)0x0;
    }
    if ((void *)(ulong)*(ushort *)((long)status_local + 0xe) <= entry_local->data) {
      entry_local->data = (void *)(long)(int)(*(ushort *)((long)status_local + 0xe) - 1);
    }
    if (*(int *)((long)&entry_local->xpk + 4) == 0) {
      if (*(int *)&entry_local->xpk == 0) {
        color._6_1_ = color._7_1_ >> 4;
        color._5_1_ = color._7_1_ & 0xf;
        switch(color._6_1_) {
        case 0:
          if (color._7_1_ == 0) {
            ReadUint8((FILE *)**(undefined8 **)status_local,1,(uint8_t *)((long)&color + 7));
            *(uint *)&entry_local->xpk = (uint)color._7_1_;
          }
          else if (color._7_1_ == 1) {
            pRVar7 = current_repeat_marker((XPKDecoder *)entry_local);
            if (pRVar7->reps != 0) {
              pRVar7->reps = pRVar7->reps - 1;
            }
            if (pRVar7->reps == 0) {
              pop_repeat_marker((XPKDecoder *)entry_local);
            }
            else {
              fseek((FILE *)**(undefined8 **)status_local,pRVar7->loc,0);
            }
          }
          else {
            uVar3 = (uint)color._5_1_;
            lVar8 = ftell((FILE *)**(undefined8 **)status_local);
            push_repeat_marker((XPKDecoder *)d_00,false,uVar3,lVar8);
          }
          break;
        case 1:
          uVar3 = (uint)color._5_1_;
          lVar8 = ftell((FILE *)**(undefined8 **)status_local);
          push_repeat_marker((XPKDecoder *)d_00,false,uVar3 + 0x10,lVar8);
          break;
        case 2:
          if (color._5_1_ == 0) {
            ReadUint16((FILE *)**(undefined8 **)status_local,1,(uint16_t *)&entry_local->offset);
            *(ulong *)&entry_local->x =
                 (ulong)(ushort)entry_local->offset + *(long *)&entry_local->x;
          }
          else {
            *(ulong *)&entry_local->x = (ulong)color._5_1_ + *(long *)&entry_local->x;
          }
          break;
        case 3:
          *(long *)&entry_local->x = (long)(int)(color._5_1_ + 0x10) + *(long *)&entry_local->x;
          break;
        case 4:
          *(uint *)&entry_local->xpk = (uint)color._5_1_;
          break;
        case 5:
          *(uint *)&entry_local->xpk = color._5_1_ + 0x10;
          break;
        case 6:
          if (color._5_1_ == 0) {
            ReadUint16((FILE *)**(undefined8 **)status_local,1,(uint16_t *)&entry_local->offset);
            *(uint *)((long)&entry_local->xpk + 4) = (uint)(ushort)entry_local->offset;
          }
          else {
            *(uint *)((long)&entry_local->xpk + 4) = (uint)color._5_1_;
          }
          break;
        case 7:
          *(uint *)((long)&entry_local->xpk + 4) = color._5_1_ + 0x10;
          break;
        case 8:
          if (color._7_1_ == 0x81) {
            pRVar7 = current_repeat_marker((XPKDecoder *)entry_local);
            if (pRVar7->reps != 0) {
              pRVar7->reps = pRVar7->reps - 1;
            }
            if (pRVar7->reps == 0) {
              pop_repeat_marker((XPKDecoder *)entry_local);
            }
            else {
              fseek((FILE *)**(undefined8 **)status_local,pRVar7->loc,0);
            }
            entry_local->x = 0;
            entry_local->y = 0;
            *(undefined4 *)&entry_local->field_0x14 = 0;
            entry_local->data = (void *)((long)entry_local->data + 1);
          }
          else {
            uVar3 = (uint)color._5_1_;
            lVar8 = ftell((FILE *)**(undefined8 **)status_local);
            push_repeat_marker((XPKDecoder *)d_00,true,uVar3,lVar8);
            entry_local->x = 0;
            entry_local->y = 0;
            *(undefined4 *)&entry_local->field_0x14 = 0;
            entry_local->data = (void *)((long)entry_local->data + 1);
          }
          break;
        case 9:
          if (color._7_1_ == 0x81) {
            pRVar7 = current_repeat_marker((XPKDecoder *)entry_local);
            if (pRVar7->reps != 0) {
              pRVar7->reps = pRVar7->reps - 1;
            }
            if (pRVar7->reps == 0) {
              pop_repeat_marker((XPKDecoder *)entry_local);
            }
            else {
              fseek((FILE *)**(undefined8 **)status_local,pRVar7->loc,0);
            }
            entry_local->x = 0;
            entry_local->y = 0;
            *(undefined4 *)&entry_local->field_0x14 = 0;
            entry_local->data = (void *)((long)entry_local->data + 1);
          }
          else {
            uVar3 = (uint)color._5_1_;
            lVar8 = ftell((FILE *)**(undefined8 **)status_local);
            push_repeat_marker((XPKDecoder *)d_00,true,uVar3 + 0x10,lVar8);
            entry_local->x = 0;
            entry_local->y = 0;
            *(undefined4 *)&entry_local->field_0x14 = 0;
            entry_local->data = (void *)((long)entry_local->data + 1);
          }
          break;
        case 10:
          if (color._5_1_ == 0) {
            ReadUint16((FILE *)**(undefined8 **)status_local,1,(uint16_t *)&entry_local->offset);
            uVar9 = (ulong)(ushort)entry_local->offset;
            entry_local->x = (short)uVar9;
            entry_local->y = (short)(uVar9 >> 0x10);
            *(int *)&entry_local->field_0x14 = (int)(uVar9 >> 0x20);
          }
          else {
            uVar9 = (ulong)color._5_1_;
            entry_local->x = (short)uVar9;
            entry_local->y = (short)(uVar9 >> 0x10);
            *(int *)&entry_local->field_0x14 = (int)(uVar9 >> 0x20);
          }
          entry_local->data = (void *)((long)entry_local->data + 1);
          break;
        case 0xb:
          lVar8 = (long)(int)(color._5_1_ + 0x10);
          entry_local->x = (short)lVar8;
          entry_local->y = (short)((ulong)lVar8 >> 0x10);
          *(int *)&entry_local->field_0x14 = (int)((ulong)lVar8 >> 0x20);
          entry_local->data = (void *)((long)entry_local->data + 1);
          break;
        case 0xc:
          *(uint *)&entry_local->xpk = (uint)color._5_1_;
          entry_local->x = 0;
          entry_local->y = 0;
          *(undefined4 *)&entry_local->field_0x14 = 0;
          entry_local->data = (void *)((long)entry_local->data + 1);
          break;
        case 0xd:
          *(uint *)&entry_local->xpk = color._5_1_ + 0x10;
          entry_local->x = 0;
          entry_local->y = 0;
          *(undefined4 *)&entry_local->field_0x14 = 0;
          entry_local->data = (void *)((long)entry_local->data + 1);
          break;
        case 0xe:
          if (color._5_1_ == 0) {
            ReadUint16((FILE *)**(undefined8 **)status_local,1,(uint16_t *)&entry_local->offset);
            *(uint *)((long)&entry_local->xpk + 4) = (uint)(ushort)entry_local->offset;
          }
          else {
            *(uint *)((long)&entry_local->xpk + 4) = (uint)color._5_1_;
          }
          entry_local->x = 0;
          entry_local->y = 0;
          *(undefined4 *)&entry_local->field_0x14 = 0;
          entry_local->data = (void *)((long)entry_local->data + 1);
          break;
        case 0xf:
          *(uint *)((long)&entry_local->xpk + 4) = color._5_1_ + 0x10;
          entry_local->x = 0;
          entry_local->y = 0;
          *(undefined4 *)&entry_local->field_0x14 = 0;
          entry_local->data = (void *)((long)entry_local->data + 1);
          break;
        default:
          lVar8 = ftell((FILE *)**(undefined8 **)status_local);
          LPWarn("xpk","?? unhandled XPK instruction: 0x%X, ftell=%ld",(ulong)bVar2,lVar8);
        }
      }
      else {
        lVar8._0_2_ = entry_local->x;
        lVar8._2_2_ = entry_local->y;
        lVar8._4_4_ = *(undefined4 *)&entry_local->field_0x14;
        rv._4_4_ = (int)entry_local->data * (uint)(ushort)(short)status_local[3] * 4 +
                   (int)(lVar8 << 2);
        puVar6 = CLU_ColorAtIndex(*(CLU **)(*(undefined8 *)status_local + 0x18),(uint)color._7_1_);
        while (*(int *)&entry_local->xpk != 0) {
          puVar4[rv._4_4_] = *puVar6;
          puVar4[rv._4_4_ + 1] = puVar6[1];
          puVar4[rv._4_4_ + 2] = puVar6[2];
          puVar4[rv._4_4_ + 3] = 0xff;
          rv._4_4_ = rv._4_4_ + 4;
          *(long *)&entry_local->x = *(long *)&entry_local->x + 1;
          *(int *)&entry_local->xpk = *(int *)&entry_local->xpk + -1;
        }
      }
    }
    else {
      lVar1._0_2_ = entry_local->x;
      lVar1._2_2_ = entry_local->y;
      lVar1._4_4_ = *(undefined4 *)&entry_local->field_0x14;
      uVar3 = (int)entry_local->data * (uint)(ushort)(short)status_local[3] * 4 + (int)(lVar1 << 2);
      puVar6 = CLU_ColorAtIndex(*(CLU **)(*(undefined8 *)status_local + 0x18),(uint)color._7_1_);
      puVar4[uVar3] = *puVar6;
      puVar4[uVar3 + 1] = puVar6[1];
      puVar4[uVar3 + 2] = puVar6[2];
      puVar4[uVar3 + 3] = 0xff;
      *(long *)&entry_local->x = *(long *)&entry_local->x + 1;
      *(int *)((long)&entry_local->xpk + 4) = *(int *)((long)&entry_local->xpk + 4) + -1;
    }
  }
  *pLStack_28 = LUNAPURPURA_OK;
  return puVar4;
}

Assistant:

uint8_t *
XPKDecoder_Decode(XPKDecoder *d, XPKEntry *entry, LPStatus *status)
{
	unsigned char byte = 0;
	unsigned char instruction = 0;
	unsigned char argument = 0;
	const uint8_t *color = NULL;
	unsigned int rgba_i = 0;
	size_t rv = 0;

	fseek(entry->xpk->file, entry->offset, SEEK_SET);

	xpk_decoder_init(d);

	/* Totally transparent RGBA matrix */
	uint8_t *rgba = calloc(entry->width * entry->height, 4 * sizeof(uint8_t));

	while (!(byte == XPKINST_EOF && d->n_reps)) {
		rv = ReadUint8(entry->xpk->file, 1, &byte);

		if (!rv) {
			LPWarn(LP_SUBSYSTEM_XPK, "couldn't ReadUint8");
			*status = LUNAPURPURA_ERROR;
			return NULL;
		}

#ifdef LUNAPURPURA_XPK_HACK
			/* XXX HACK!! */
			if (d->cur_y >= entry->height) {
				d->cur_y = entry->height - 1;
			}
#endif

		if (d->direct_counter > 0) {
			/* DIRECT MODE ENABLED */
			rgba_i = (d->cur_y * entry->width * 4) + (d->cur_x * 4);
			color = CLU_ColorAtIndex(entry->xpk->clu, byte);
#ifdef LUNAPURPURA_XPK_TRACE
			LPWarn(LP_SUBSYSTEM_XPK, "(writing color %d)", byte);
#endif
			SET_COLOR(rgba, rgba_i, color[0], color[1], color[2]);
			d->cur_x++;
			d->direct_counter--;
		} else {
			/* DIRECT MODE OFF OR EXPIRED */
			if (d->n_reps > 0) {
				/* RLE ENGAGED */
				rgba_i = (d->cur_y * entry->width * 4) + (d->cur_x * 4);
				color = CLU_ColorAtIndex(entry->xpk->clu, byte);
#ifdef LUNAPURPURA_XPK_TRACE
					LPWarn(LP_SUBSYSTEM_XPK, "(writing %d reps of color %d)", d->n_reps, byte);
#endif
				for (; d->n_reps > 0; d->n_reps--) {
					SET_COLOR(rgba, rgba_i, color[0], color[1], color[2]);
					d->cur_x++;
				}
			} else {
				/* NEED A NEW INSTRUCTION */
				instruction = byte >> 4; /* First 4 bits */
				argument = byte & 0x0F; /* Last 4 bits */

				switch (instruction) {
				case XPKINST_REPEAT:
					{
						switch (byte) {
						case XPKINST_RLENEXT:
							ReadUint8(entry->xpk->file, 1 , &byte);
							d->n_reps = byte;
#ifdef LUNAPURPURA_XPK_TRACE
							LPWarn(LP_SUBSYSTEM_XPK, "RLENEXT %d", byte);
#endif
							break;
						case XPKINST_REPEAT_END:
							{
								struct RepeatMarker *marker = current_repeat_marker(d);
								if (marker->reps > 0) {
											 marker->reps--;
								}
								if (marker->reps > 0) {
									fseek(entry->xpk->file, marker->loc, SEEK_SET);
#ifdef LUNAPURPURA_XPK_TRACE
									LPWarn(LP_SUBSYSTEM_XPK, "REPEAT_END (%d remaining)", marker->reps);
#endif
								} else {
									pop_repeat_marker(d);
								}
							}
							break;
						default:
							push_repeat_marker(d, false, argument, ftell(entry->xpk->file));
#ifdef LUNAPURPURA_XPK_TRACE
							LPWarn(LP_SUBSYSTEM_XPK, "REPEAT %d", argument);
#endif
						}
					}
					break;
				case XPKINST_BIGREPEAT:
					push_repeat_marker(d, false, 16+argument, ftell(entry->xpk->file));
#ifdef LUNAPURPURA_XPK_TRACE
					LPWarn(LP_SUBSYSTEM_XPK, "BIGREPEAT %d", 16+argument);
#endif
					break;
				case XPKINST_XSKIP:
					if (argument) {
						d->cur_x += argument;
#ifdef LUNAPURPURA_XPK_TRACE
						LPWarn(LP_SUBSYSTEM_XPK, "XSKIP %d", argument);
#endif
					} else {
						ReadUint16(entry->xpk->file, 1, &d->next_holder);
						d->cur_x += d->next_holder;
#ifdef LUNAPURPURA_XPK_TRACE
						LPWarn(LP_SUBSYSTEM_XPK, "XSKIP %d", d->next_holder);
#endif
					}
					break;
				case XPKINST_BIGXSKIP:
					d->cur_x += (16 + argument);
#ifdef LUNAPURPURA_XPK_TRACE
					LPWarn(LP_SUBSYSTEM_XPK, "BIGXSKIP %d", 16+argument);
#endif
					break;
				case XPKINST_RLE:
					/* 0x40 should be safe to ignore */
					d->n_reps = argument;
#ifdef LUNAPURPURA_XPK_TRACE
					LPWarn(LP_SUBSYSTEM_XPK, "RLE %d", argument);
#endif
					break;
				case XPKINST_BIGRLE:
					d->n_reps = (16 + argument);
#ifdef LUNAPURPURA_XPK_TRACE
					LPWarn(LP_SUBSYSTEM_XPK, "BIGRLE %d", 16+argument);
#endif
					break;
				case XPKINST_DIRECT:
					{
						if (argument) {
							d->direct_counter = argument;
#ifdef LUNAPURPURA_XPK_TRACE
							LPWarn(LP_SUBSYSTEM_XPK, "DIRECT %d", argument);
#endif
						} else {
							ReadUint16(entry->xpk->file, 1, &d->next_holder);
							d->direct_counter = d->next_holder;
#ifdef LUNAPURPURA_XPK_TRACE
							LPWarn(LP_SUBSYSTEM_XPK, "DIRECT %d", d->next_holder);
#endif
						}
					}
					break;
				case XPKINST_BIGDIRECT:
					d->direct_counter = (16 + argument);
#ifdef LUNAPURPURA_XPK_TRACE
					LPWarn(LP_SUBSYSTEM_XPK, "BIGDIRECT %d", 16+argument);
#endif
					break;
				case XPKINST_LINEREPEAT:
					{
						switch (byte) {
						case XPKINST_LINEREPEAT_END:
							{
								struct RepeatMarker *marker = current_repeat_marker(d);
								if (marker->reps > 0) {
									marker->reps--;
								}
								if (marker->reps > 0) {
									fseek(entry->xpk->file, marker->loc, SEEK_SET);
								} else {
									pop_repeat_marker(d);
								}
								NEWLINE(d);
#ifdef LUNAPURPURA_XPK_TRACE
								LPWarn(LP_SUBSYSTEM_XPK, "LINEREPEAT_END (%d remaining)", marker->reps);
#endif
								break;
							}
						default:
							push_repeat_marker(d, true, argument, ftell(entry->xpk->file));
							NEWLINE(d);
#ifdef LUNAPURPURA_XPK_TRACE
							LPWarn(LP_SUBSYSTEM_XPK, "LINEREPEAT %d", argument);
#endif
						}
					}
					break;
				case XPKINST_BIGLINEREPEAT:
					{
						switch (byte) {
						case XPKINST_LINEREPEAT_END:
							{
								struct RepeatMarker *marker = current_repeat_marker(d);
								if (marker->reps > 0) {
									marker->reps--;
								}
								if (marker->reps > 0) {
									fseek(entry->xpk->file, marker->loc, SEEK_SET);
								} else {
									pop_repeat_marker(d);
								}
								NEWLINE(d);
#ifdef LUNAPURPURA_XPK_TRACE
								LPWarn(LP_SUBSYSTEM_XPK, "BIGLINEREPEAT_END (%d remaining)", marker->reps);
#endif
								break;
							}
						default:
							push_repeat_marker(d, true, 16+argument, ftell(entry->xpk->file));
							NEWLINE(d);
#ifdef LUNAPURPURA_XPK_TRACE
							LPWarn(LP_SUBSYSTEM_XPK, "BIGLINEREPEAT %d", 16+argument);
#endif
						}
					}
					break;
				case XPKINST_SETXNL:
					if (argument) {
						d->cur_x = argument;
#ifdef LUNAPURPURA_XPK_TRACE
						LPWarn(LP_SUBSYSTEM_XPK, "SETXNL %d", argument);
#endif
					} else {
						ReadUint16(entry->xpk->file, 1, &d->next_holder);
						d->cur_x = d->next_holder;
#ifdef LUNAPURPURA_XPK_TRACE
						LPWarn(LP_SUBSYSTEM_XPK, "SETXNL %d", d->next_holder);
#endif
					}
					d->cur_y++;
					break;
				case XPKINST_BIGSETXNL:
					d->cur_x = (16 + argument);
					d->cur_y++;
#ifdef LUNAPURPURA_XPK_TRACE
					LPWarn(LP_SUBSYSTEM_XPK, "BIGSETXNL %d", 16+argument);
#endif
					break;
				case XPKINST_RLENL:
					d->n_reps = argument;
					NEWLINE(d);
#ifdef LUNAPURPURA_XPK_TRACE
					LPWarn(LP_SUBSYSTEM_XPK, "RLENL %d", argument);
#endif
					break;
				case XPKINST_BIGRLENL:
					d->n_reps = (16 + argument);
					NEWLINE(d);
#ifdef LUNAPURPURA_XPK_TRACE
					LPWarn(LP_SUBSYSTEM_XPK, "BIGRLENL %d", 16+argument);
#endif
					break;
				case XPKINST_DIRECTNL:
					if (argument) {
						d->direct_counter = argument;
#ifdef LUNAPURPURA_XPK_TRACE
						LPWarn(LP_SUBSYSTEM_XPK, "DIRECTNL %d", argument);
#endif
					} else {
						ReadUint16(entry->xpk->file, 1, &d->next_holder);
						d->direct_counter = d->next_holder;
#ifdef LUNAPURPURA_XPK_TRACE
						LPWarn(LP_SUBSYSTEM_XPK, "DIRECTNL %d", d->next_holder);
#endif
					}
					NEWLINE(d);
					break;
				case XPKINST_BIGDIRECTNL:
					d->direct_counter = (16 + argument);
					NEWLINE(d);
#ifdef LUNAPURPURA_XPK_TRACE
					LPWarn(LP_SUBSYSTEM_XPK, "BIGDIRECTNL %d", 16+argument);
#endif
					break;
				default:
					LPWarn(LP_SUBSYSTEM_XPK, "?? unhandled XPK instruction: 0x%X, ftell=%ld", byte, ftell(entry->xpk->file));
				}
			}
		}
	}

	*status = LUNAPURPURA_OK;
	return rgba;
}